

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetPortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetPortHeaderSyntax,slang::syntax::NetPortHeaderSyntax_const&>
          (BumpAllocator *this,NetPortHeaderSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  DataTypeSyntax *pDVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  NetPortHeaderSyntax *pNVar15;
  
  pNVar15 = (NetPortHeaderSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_PortHeaderSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortHeaderSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PortHeaderSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->direction).kind;
  uVar8 = (args->direction).field_0x2;
  NVar9.raw = (args->direction).numFlags.raw;
  uVar10 = (args->direction).rawLen;
  pIVar3 = (args->direction).info;
  TVar11 = (args->netType).kind;
  uVar12 = (args->netType).field_0x2;
  NVar13.raw = (args->netType).numFlags.raw;
  uVar14 = (args->netType).rawLen;
  pIVar4 = (args->netType).info;
  pDVar5 = (args->dataType).ptr;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.kind =
       (args->super_PortHeaderSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar15->super_PortHeaderSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.parent = pSVar1;
  (pNVar15->super_PortHeaderSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar15->direction).kind = TVar7;
  (pNVar15->direction).field_0x2 = uVar8;
  (pNVar15->direction).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar15->direction).rawLen = uVar10;
  (pNVar15->direction).info = pIVar3;
  (pNVar15->netType).kind = TVar11;
  (pNVar15->netType).field_0x2 = uVar12;
  (pNVar15->netType).numFlags = (NumericTokenFlags)NVar13.raw;
  (pNVar15->netType).rawLen = uVar14;
  (pNVar15->netType).info = pIVar4;
  (pNVar15->dataType).ptr = pDVar5;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }